

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen11Texture.cpp
# Opt level: O0

void __thiscall
GmmLib::GmmGen11TextureCalc::FillPlanarOffsetAddress
          (GmmGen11TextureCalc *this,GMM_TEXTURE_INFO *pTexInfo)

{
  bool bVar1;
  sbyte sVar2;
  uint32_t uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  GMM_PLATFORM_INFO *pGVar7;
  GMM_GFX_SIZE_T *pGVar8;
  GMM_GFX_SIZE_T *pGVar9;
  ulong uVar10;
  SKU_FEATURE_TABLE *pSVar11;
  WA_TABLE *pWVar12;
  GMM_GFX_SIZE_T GVar13;
  ulong uVar14;
  bool bVar15;
  ulong local_e8;
  int local_e0;
  uint local_d4;
  uint32_t local_c4;
  GMM_GFX_SIZE_T TileWidth_1;
  GMM_GFX_SIZE_T TileHeight_1;
  GMM_GFX_SIZE_T PhysicalTileHeight;
  GMM_GFX_SIZE_T TileWidth;
  GMM_GFX_SIZE_T TileHeight;
  uint32_t YSizeForUVPurposesDimensionalAlignment;
  uint32_t YSizeForUVPurposes;
  uint32_t UOffset;
  uint32_t VSize;
  uint32_t YVSizeRShift;
  uint32_t YSize;
  GMM_GFX_SIZE_T *pTemp_2;
  GMM_GFX_SIZE_T *pTemp_1;
  GMM_GFX_SIZE_T *pTemp;
  GMM_PLATFORM_INFO *pPlatform;
  uint32_t local_48;
  uint32_t WidthBytesPhysical;
  uint32_t Height;
  uint32_t uStack_3c;
  bool UVPacked;
  uint32_t VHeight;
  uint32_t YHeight;
  GMM_GFX_SIZE_T *pVOffsetY;
  GMM_GFX_SIZE_T *pVOffsetX;
  GMM_GFX_SIZE_T *pUOffsetY;
  GMM_GFX_SIZE_T *pUOffsetX;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmGen11TextureCalc *this_local;
  
  uStack_3c = 0;
  Height = 0;
  bVar1 = false;
  local_d4 = (int)pTexInfo->BaseWidth * pTexInfo->BitsPerPixel >> 3;
  if (((pTexInfo != (GMM_TEXTURE_INFO *)0x0) && ((int)pTexInfo->TileMode < 0x6d)) &&
     (-1 < (int)pTexInfo->TileMode)) {
    pGVar7 = GmmGetPlatformInfo((this->super_GmmGen10TextureCalc).super_GmmGen9TextureCalc.
                                super_GmmTextureCalc.pGmmLibContext);
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[1] = 0;
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[5] = 0;
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[9] = 0;
    (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[9] = 0;
    local_48 = pTexInfo->BaseHeight;
    if (((ulong)(pTexInfo->Flags).Gpu >> 0x29 & 1) != 0) {
      if ((((ulong)(pTexInfo->Flags).Gpu >> 6 & 1) == 0) &&
         (((ulong)(pTexInfo->Flags).Gpu >> 0x1d & 1) == 0)) {
        local_c4 = 1;
      }
      else {
        local_c4 = (pTexInfo->MSAA).NumSamples;
      }
      uVar3 = GmmTextureCalc::ExpandHeight
                        ((GmmTextureCalc *)this,local_48,(pTexInfo->Alignment).VAlign,local_c4);
      local_48 = (*(this->super_GmmGen10TextureCalc).super_GmmGen9TextureCalc.super_GmmTextureCalc.
                   _vptr_GmmTextureCalc[0x17])(this,pTexInfo,(ulong)uVar3);
      if (((ulong)(pTexInfo->Flags).Gpu >> 0x25 & 1) != 0) {
        (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[5] = 0;
      }
    }
    pUOffsetY = (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset + 2;
    pVOffsetX = (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset + 6;
    pGVar8 = (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset + 3;
    pGVar9 = (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset + 7;
    _VHeight = pGVar9;
    pVOffsetY = pGVar8;
    switch(pTexInfo->Format) {
    case GMM_FORMAT_BGRP:
    case GMM_FORMAT_RGBP:
      if (((ulong)(pTexInfo->Flags).Info >> 0x13 & 1) == 0) {
        *pUOffsetY = 0;
        uStack_3c = (pTexInfo->BaseHeight + 0xf) - (pTexInfo->BaseHeight + 0xf & 0xf);
        *pVOffsetX = (ulong)((pTexInfo->BaseHeight + 0xf) - (pTexInfo->BaseHeight + 0xf & 0xf));
        *pGVar8 = 0;
        Height = (pTexInfo->BaseHeight + 0xf) - (pTexInfo->BaseHeight + 0xf & 0xf);
        *pGVar9 = (ulong)((pTexInfo->BaseHeight + 0xf) - (pTexInfo->BaseHeight + 0xf & 0xf)) << 1;
      }
      else {
        *pUOffsetY = 0;
        uStack_3c = pTexInfo->BaseHeight;
        *pVOffsetX = (ulong)pTexInfo->BaseHeight;
        *pGVar8 = 0;
        Height = pTexInfo->BaseHeight;
        *pGVar9 = (ulong)pTexInfo->BaseHeight << 1;
      }
      break;
    default:
      break;
    case GMM_FORMAT_I420:
    case GMM_FORMAT_IYUV:
      _VHeight = pVOffsetX;
      pVOffsetY = pUOffsetY;
      pVOffsetX = pGVar9;
      pUOffsetY = pGVar8;
    case GMM_FORMAT_YV12:
    case GMM_FORMAT_YVU9:
      iVar4 = (int)pTexInfo->Pitch * pTexInfo->BaseHeight;
      sVar2 = 4;
      if (pTexInfo->Format != GMM_FORMAT_YVU9) {
        sVar2 = 2;
      }
      iVar5 = 4;
      if (pTexInfo->Format != GMM_FORMAT_YVU9) {
        iVar5 = 2;
      }
      uVar6 = (((int)pTexInfo->Pitch + iVar5 + -1) -
              ((int)pTexInfo->Pitch + iVar5 + -1 & iVar5 - 1U)) *
              ((pTexInfo->BaseHeight + iVar5 + -1) -
              (pTexInfo->BaseHeight + iVar5 + -1 & iVar5 - 1U)) >> sVar2;
      *pVOffsetY = 0;
      *_VHeight = (ulong)pTexInfo->BaseHeight;
      *pUOffsetY = (ulong)(iVar4 + uVar6) % pTexInfo->Pitch;
      *pVOffsetX = (ulong)(iVar4 + uVar6) / pTexInfo->Pitch;
      if (local_d4 == 0) {
        local_d4 = iVar4 + uVar6 * 2;
      }
      else {
        local_d4 = (iVar4 + uVar6 * 2 + (local_d4 - 1)) / local_d4;
      }
      uStack_3c = local_d4;
      break;
    case GMM_FORMAT_IMC1:
      _VHeight = pVOffsetX;
      pVOffsetY = pUOffsetY;
      pVOffsetX = pGVar9;
      pUOffsetY = pGVar8;
    case GMM_FORMAT_IMC3:
    case GMM_FORMAT_MFX_JPEG_YUV420:
    case GMM_FORMAT_MFX_JPEG_YUV422V:
      *pUOffsetY = 0;
      uStack_3c = (pTexInfo->BaseHeight + 0xf) - (pTexInfo->BaseHeight + 0xf & 0xf);
      *pVOffsetX = (ulong)((pTexInfo->BaseHeight + 0xf) - (pTexInfo->BaseHeight + 0xf & 0xf));
      *pVOffsetY = 0;
      Height = ((pTexInfo->BaseHeight + 1 >> 1) + 0xf) -
               ((pTexInfo->BaseHeight + 1 >> 1) + 0xf & 0xf);
      *_VHeight = (ulong)((pTexInfo->BaseHeight - (pTexInfo->BaseHeight + 0xf & 0xf)) +
                         (((pTexInfo->BaseHeight + 1 >> 1) + 0x1e) -
                         ((pTexInfo->BaseHeight + 1 >> 1) + 0xf & 0xf)));
      break;
    case GMM_FORMAT_IMC2:
      _VHeight = pVOffsetX;
      pVOffsetY = pUOffsetY;
      pVOffsetX = pGVar9;
      pUOffsetY = pGVar8;
    case GMM_FORMAT_IMC4:
      *pUOffsetY = 0;
      uStack_3c = (pTexInfo->BaseHeight + 0xf) - (pTexInfo->BaseHeight + 0xf & 0xf);
      *pVOffsetX = (ulong)((pTexInfo->BaseHeight + 0xf) - (pTexInfo->BaseHeight + 0xf & 0xf));
      *pVOffsetY = pTexInfo->Pitch >> 1;
      Height = uStack_3c + 1 >> 1;
      *_VHeight = (ulong)((pTexInfo->BaseHeight + 0xf) - (pTexInfo->BaseHeight + 0xf & 0xf));
      bVar1 = true;
      break;
    case GMM_FORMAT_MFX_JPEG_YUV411:
    case GMM_FORMAT_MFX_JPEG_YUV422H:
    case GMM_FORMAT_MFX_JPEG_YUV444:
      *pUOffsetY = 0;
      uStack_3c = (pTexInfo->BaseHeight + 0xf) - (pTexInfo->BaseHeight + 0xf & 0xf);
      *pVOffsetX = (ulong)((pTexInfo->BaseHeight + 0xf) - (pTexInfo->BaseHeight + 0xf & 0xf));
      *pGVar8 = 0;
      Height = (pTexInfo->BaseHeight + 0xf) - (pTexInfo->BaseHeight + 0xf & 0xf);
      *pGVar9 = (ulong)(((pTexInfo->BaseHeight + 0xf) - (pTexInfo->BaseHeight + 0xf & 0xf)) * 2);
      break;
    case GMM_FORMAT_MFX_JPEG_YUV411R:
      *pUOffsetY = 0;
      uStack_3c = (pTexInfo->BaseHeight + 0xf) - (pTexInfo->BaseHeight + 0xf & 0xf);
      *pVOffsetX = (ulong)((pTexInfo->BaseHeight + 0xf) - (pTexInfo->BaseHeight + 0xf & 0xf));
      *pGVar8 = 0;
      Height = ((pTexInfo->BaseHeight + 3 >> 2) + 0xf) -
               ((pTexInfo->BaseHeight + 3 >> 2) + 0xf & 0xf);
      *pGVar9 = (ulong)((pTexInfo->BaseHeight - (pTexInfo->BaseHeight + 0xf & 0xf)) +
                       (((pTexInfo->BaseHeight + 3 >> 2) + 0x1e) -
                       ((pTexInfo->BaseHeight + 3 >> 2) + 0xf & 0xf)));
      break;
    case GMM_FORMAT_NV11:
    case GMM_FORMAT_NV12:
    case GMM_FORMAT_NV21:
    case GMM_FORMAT_P010:
    case GMM_FORMAT_P012:
    case GMM_FORMAT_P016:
    case GMM_FORMAT_P208:
    case GMM_FORMAT_P216:
      *pGVar8 = 0;
      *pUOffsetY = 0;
      uStack_3c = (local_48 + 1) - (local_48 + 1 & 1);
      *pGVar9 = (ulong)uStack_3c;
      *pVOffsetX = (ulong)uStack_3c;
      if (((pTexInfo->Format == GMM_FORMAT_NV12) || (pTexInfo->Format == GMM_FORMAT_NV21)) ||
         ((pTexInfo->Format == GMM_FORMAT_P010 ||
          ((pTexInfo->Format == GMM_FORMAT_P012 ||
           (Height = uStack_3c, pTexInfo->Format == GMM_FORMAT_P016)))))) {
        Height = local_48 + 1 >> 1;
      }
      bVar1 = true;
    }
    *(ulong *)((long)&(pTexInfo->OffsetInfo).field_0 + 0x50) = (ulong)uStack_3c;
    if ((pTexInfo->OffsetInfo).field_0.Plane.NoOfPlanes == 2) {
      *(ulong *)((long)&(pTexInfo->OffsetInfo).field_0 + 0x58) = (ulong)Height;
    }
    else if ((pTexInfo->OffsetInfo).field_0.Plane.NoOfPlanes == 3) {
      (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[0xb] = (ulong)Height;
      (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[10] = (ulong)Height;
    }
    if ((pGVar7->TileInfo[pTexInfo->TileMode].LogicalSize != 0) ||
       (((ulong)(pTexInfo->Flags).Gpu >> 0x29 & 1) != 0)) {
      TileWidth = (GMM_GFX_SIZE_T)pGVar7->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
      uVar10 = (ulong)pGVar7->TileInfo[pTexInfo->TileMode].LogicalTileWidth;
      if ((0x10 < (int)(pGVar7->Platform).eRenderCoreFamily) &&
         ((((ulong)(pTexInfo->Flags).Gpu >> 1 & 1) != 0 &&
          (pSVar11 = Context::GetSkuTable
                               ((this->super_GmmGen10TextureCalc).super_GmmGen9TextureCalc.
                                super_GmmTextureCalc.pGmmLibContext),
          ((ulong)pSVar11->field_1 >> 0x19 & 1) == 0)))) {
        if ((((ulong)(pTexInfo->Flags).Info >> 0x26 & 1) == 0) &&
           (((ulong)(pTexInfo->Flags).Info >> 0x2c & 1) == 0)) {
          pWVar12 = Context::GetWaTable((this->super_GmmGen10TextureCalc).super_GmmGen9TextureCalc.
                                        super_GmmTextureCalc.pGmmLibContext);
          if ((*(ulong *)&pWVar12->field_0x4 >> 0x2e & 1) == 0) {
            Context::GetWaTable((this->super_GmmGen10TextureCalc).super_GmmGen9TextureCalc.
                                super_GmmTextureCalc.pGmmLibContext);
          }
          pWVar12 = Context::GetWaTable((this->super_GmmGen10TextureCalc).super_GmmGen9TextureCalc.
                                        super_GmmTextureCalc.pGmmLibContext);
          if ((*(ulong *)&pWVar12->field_0x4 >> 0x2e & 1) == 0) {
            pWVar12 = Context::GetWaTable((this->super_GmmGen10TextureCalc).super_GmmGen9TextureCalc
                                          .super_GmmTextureCalc.pGmmLibContext);
            local_e0 = 0x40;
            if (((uint)((ulong)*(undefined8 *)&pWVar12->field_0x4 >> 0x2f) & 1) != 0) {
              local_e0 = 4;
            }
          }
          else {
            local_e0 = 1;
          }
        }
        else {
          pWVar12 = Context::GetWaTable((this->super_GmmGen10TextureCalc).super_GmmGen9TextureCalc.
                                        super_GmmTextureCalc.pGmmLibContext);
          bVar15 = false;
          if (((uint)((ulong)*(undefined8 *)&pWVar12->field_0x4 >> 0x2f) & 1) == 0) {
            pWVar12 = Context::GetWaTable((this->super_GmmGen10TextureCalc).super_GmmGen9TextureCalc
                                          .super_GmmTextureCalc.pGmmLibContext);
            bVar15 = (*(ulong *)&pWVar12->field_0x4 >> 0x2e & 1) == 0;
          }
          local_e0 = 1;
          if (bVar15) {
            local_e0 = 0x10;
          }
        }
        TileWidth = (long)local_e0 * TileWidth;
      }
      *pUOffsetY = (*pUOffsetY + (uVar10 - 1)) - (*pUOffsetY + (uVar10 - 1) & uVar10 - 1);
      *pVOffsetX = (*pVOffsetX + (TileWidth - 1)) - (*pVOffsetX + (TileWidth - 1) & TileWidth - 1);
      *pVOffsetY = (*pVOffsetY + (uVar10 - 1)) - (*pVOffsetY + (uVar10 - 1) & uVar10 - 1);
      if (bVar1) {
        local_e8 = (*_VHeight + (TileWidth - 1)) - (*_VHeight + (TileWidth - 1) & TileWidth - 1);
      }
      else {
        local_e8 = (((ulong)uStack_3c + TileWidth * 2) -
                   ((ulong)uStack_3c + (TileWidth - 1) & TileWidth - 1)) +
                   (((ulong)Height - 2) - ((ulong)Height + (TileWidth - 1) & TileWidth - 1));
      }
      *_VHeight = local_e8;
      if ((((ulong)(pTexInfo->Flags).Gpu >> 0x25 & 1) != 0) &&
         (((ulong)(pTexInfo->Flags).Gpu >> 0x29 & 1) != 0)) {
        *pVOffsetX = (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[5] + *pVOffsetX;
        *_VHeight = *pVOffsetX;
      }
      pSVar11 = Context::GetSkuTable
                          ((this->super_GmmGen10TextureCalc).super_GmmGen9TextureCalc.
                           super_GmmTextureCalc.pGmmLibContext);
      if (((ulong)pSVar11->field_1 >> 0x1c & 1) != 0) {
        (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[0xd] =
             ((ulong)uStack_3c + (TileWidth - 1)) -
             ((ulong)uStack_3c + (TileWidth - 1) & TileWidth - 1);
        if ((pTexInfo->OffsetInfo).field_0.Plane.NoOfPlanes == 2) {
          (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[0xe] =
               ((ulong)Height + (TileWidth - 1)) - ((ulong)Height + (TileWidth - 1) & TileWidth - 1)
          ;
        }
        else if ((pTexInfo->OffsetInfo).field_0.Plane.NoOfPlanes == 3) {
          GVar13 = ((ulong)Height + (TileWidth - 1)) -
                   ((ulong)Height + (TileWidth - 1) & TileWidth - 1);
          (pTexInfo->OffsetInfo).field_0.Texture2DOffsetInfo.Offset[0xe] = GVar13;
          (pTexInfo->OffsetInfo).field_0.Texture3DOffsetInfo.Offset[0xe] = GVar13;
        }
      }
    }
    if (((((ulong)(pTexInfo->Flags).Gpu >> 0x10 & 1) != 0) &&
        (((ulong)(pTexInfo->Flags).Gpu >> 0x25 & 1) != 0)) &&
       (((ulong)(pTexInfo->Flags).Info >> 0x24 & 1) != 0)) {
      pGVar7 = Context::GetPlatformInfo
                         ((this->super_GmmGen10TextureCalc).super_GmmGen9TextureCalc.
                          super_GmmTextureCalc.pGmmLibContext);
      uVar14 = (ulong)pGVar7->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
      pGVar7 = Context::GetPlatformInfo
                         ((this->super_GmmGen10TextureCalc).super_GmmGen9TextureCalc.
                          super_GmmTextureCalc.pGmmLibContext);
      uVar10 = (ulong)pGVar7->TileInfo[pTexInfo->TileMode].LogicalTileWidth;
      *pUOffsetY = (*pUOffsetY + (uVar10 - 1)) - (*pUOffsetY + (uVar10 - 1) & uVar10 - 1);
      *pVOffsetX = (*pVOffsetX + (uVar14 - 1)) - (*pVOffsetX + (uVar14 - 1) & uVar14 - 1);
      *pVOffsetY = (*pVOffsetY + (uVar10 - 1)) - (*pVOffsetY + (uVar10 - 1) & uVar10 - 1);
      *_VHeight = (*_VHeight + (uVar14 - 1)) - (*_VHeight + (uVar14 - 1) & uVar14 - 1);
    }
  }
  return;
}

Assistant:

void GmmLib::GmmGen11TextureCalc::FillPlanarOffsetAddress(GMM_TEXTURE_INFO *pTexInfo)
{
    GMM_GFX_SIZE_T *pUOffsetX, *pUOffsetY;
    GMM_GFX_SIZE_T *pVOffsetX, *pVOffsetY;
    uint32_t        YHeight = 0, VHeight = 0;
    bool            UVPacked = false;
    uint32_t        Height;
    uint32_t        WidthBytesPhysical = GFX_ULONG_CAST(pTexInfo->BaseWidth) * pTexInfo->BitsPerPixel >> 3;

#define SWAP_UV()              \
    {                          \
        GMM_GFX_SIZE_T *pTemp; \
                               \
        pTemp     = pUOffsetX; \
        pUOffsetX = pVOffsetX; \
        pVOffsetX = pTemp;     \
                               \
        pTemp     = pUOffsetY; \
        pUOffsetY = pVOffsetY; \
        pVOffsetY = pTemp;     \
    }

    __GMM_ASSERTPTR(pTexInfo, VOIDRETURN);
    __GMM_ASSERTPTR(((pTexInfo->TileMode < GMM_TILE_MODES) && (pTexInfo->TileMode >= TILE_NONE)), VOIDRETURN);
    GMM_DPF_ENTER;

    const GMM_PLATFORM_INFO *pPlatform = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);

    // GMM_PLANE_Y always at (0, 0)...
    pTexInfo->OffsetInfo.Plane.X[GMM_PLANE_Y] = 0;
    pTexInfo->OffsetInfo.Plane.Y[GMM_PLANE_Y] = 0;

    pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_Y] = 0;
    pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_Y] = 0;

    Height = pTexInfo->BaseHeight;
    if(pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
    {
        Height = __GMM_EXPAND_HEIGHT(this, Height, pTexInfo->Alignment.VAlign, pTexInfo);
        Height = ScaleTextureHeight(pTexInfo, Height);
        if(pTexInfo->Flags.Gpu.UnifiedAuxSurface)
        {
            pTexInfo->OffsetInfo.Plane.Y[GMM_PLANE_Y] = 0;
        }
    }

    // GMM_PLANE_U/V Planes...
    pUOffsetX = &pTexInfo->OffsetInfo.Plane.X[GMM_PLANE_U];
    pUOffsetY = &pTexInfo->OffsetInfo.Plane.Y[GMM_PLANE_U];
    pVOffsetX = &pTexInfo->OffsetInfo.Plane.X[GMM_PLANE_V];
    pVOffsetY = &pTexInfo->OffsetInfo.Plane.Y[GMM_PLANE_V];

    switch(pTexInfo->Format)
    {
        case GMM_FORMAT_IMC1:
            SWAP_UV(); // IMC1 = IMC3 with Swapped U/V
        case GMM_FORMAT_IMC3:
        case GMM_FORMAT_MFX_JPEG_YUV420:  // Same as IMC3.
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // UUUU
                                          // UUUU
                                          // VVVV
                                          // VVVV
        case GMM_FORMAT_MFX_JPEG_YUV422V: // Similar to IMC3 but U/V are full width.
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // UUUUUUUU
                                          // UUUUUUUU
                                          // VVVVVVVV
                                          // VVVVVVVV
            {
                *pUOffsetX = 0;
                YHeight    = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
                *pUOffsetY = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

                *pVOffsetX = 0;
                VHeight    = GFX_ALIGN(GFX_CEIL_DIV(pTexInfo->BaseHeight, 2), GMM_IMCx_PLANE_ROW_ALIGNMENT);
                *pVOffsetY =
                GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT) +
                GFX_ALIGN(GFX_CEIL_DIV(pTexInfo->BaseHeight, 2), GMM_IMCx_PLANE_ROW_ALIGNMENT);

                break;
            }
        case GMM_FORMAT_MFX_JPEG_YUV411R_TYPE: //Similar to IMC3 but U/V are quarther height and full width.
                                               //YYYYYYYY
                                               //YYYYYYYY
                                               //YYYYYYYY
                                               //YYYYYYYY
                                               //UUUUUUUU
                                               //VVVVVVVV
            {
                *pUOffsetX = 0;
                YHeight    = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
                *pUOffsetY = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

                *pVOffsetX = 0;
                VHeight    = GFX_ALIGN(GFX_CEIL_DIV(pTexInfo->BaseHeight, 4), GMM_IMCx_PLANE_ROW_ALIGNMENT);
                *pVOffsetY =
                GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT) +
                GFX_ALIGN(GFX_CEIL_DIV(pTexInfo->BaseHeight, 4), GMM_IMCx_PLANE_ROW_ALIGNMENT);

                break;
            }
        case GMM_FORMAT_MFX_JPEG_YUV411:  // Similar to IMC3 but U/V are quarter width and full height.
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // UU
                                          // UU
                                          // UU
                                          // UU
                                          // VV
                                          // VV
                                          // VV
                                          // VV
        case GMM_FORMAT_MFX_JPEG_YUV422H: // Similar to IMC3 but U/V are full height.
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // YYYYYYYY
                                          // UUUU
                                          // UUUU
                                          // UUUU
                                          // UUUU
                                          // VVVV
                                          // VVVV
                                          // VVVV
                                          // VVVV
        case GMM_FORMAT_MFX_JPEG_YUV444: // Similar to IMC3 but U/V are full size.
                                         // YYYYYYYY
                                         // YYYYYYYY
                                         // YYYYYYYY
                                         // YYYYYYYY
                                         // UUUUUUUU
                                         // UUUUUUUU
                                         // UUUUUUUU
                                         // UUUUUUUU
                                         // VVVVVVVV
                                         // VVVVVVVV
                                         // VVVVVVVV
                                         // VVVVVVVV
            {
                *pUOffsetX = 0;
                YHeight    = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
                *pUOffsetY = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

                *pVOffsetX = 0;
                VHeight    = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
                *pVOffsetY = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT) * 2;

                break;
            }
        case GMM_FORMAT_BGRP:
        case GMM_FORMAT_RGBP:
        {
            //For RGBP linear Tile keep resource Offset non aligned and for other Tile format to be 16-bit aligned
            if(pTexInfo->Flags.Info.Linear)
            {
                *pUOffsetX = 0;
                YHeight    = pTexInfo->BaseHeight;
                *pUOffsetY = pTexInfo->BaseHeight;

                *pVOffsetX = 0;
                VHeight    = pTexInfo->BaseHeight;
                *pVOffsetY = (GMM_GFX_SIZE_T)pTexInfo->BaseHeight * 2;
            }
            else //Tiled
            {
                *pUOffsetX = 0;
                YHeight    = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
                *pUOffsetY = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

                *pVOffsetX = 0;
                VHeight    = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
                *pVOffsetY = (GMM_GFX_SIZE_T)GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT) * 2;
            }
            break;
        }
        case GMM_FORMAT_IMC2:
            SWAP_UV(); // IMC2 = IMC4 with Swapped U/V
        case GMM_FORMAT_IMC4:
        {
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // UUUUVVVV
            // UUUUVVVV

            __GMM_ASSERT((pTexInfo->Pitch & 1) == 0);

            *pUOffsetX = 0;
            YHeight    = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);
            *pUOffsetY = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

            *pVOffsetX = pTexInfo->Pitch / 2;
            VHeight    = GFX_CEIL_DIV(YHeight, 2);
            *pVOffsetY = GFX_ALIGN(pTexInfo->BaseHeight, GMM_IMCx_PLANE_ROW_ALIGNMENT);

            // Not technically UV packed but sizing works out the same
            UVPacked = true;

            break;
        }
        case GMM_FORMAT_I420: // I420 = IYUV
        case GMM_FORMAT_IYUV:
            SWAP_UV(); // I420/IYUV = YV12 with Swapped U/V
        case GMM_FORMAT_YV12:
        case GMM_FORMAT_YVU9:
        {
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // VVVVVV..  <-- V and U planes follow the Y plane, as linear
            // ..UUUUUU      arrays--without respect to pitch.

            uint32_t YSize, YVSizeRShift, VSize, UOffset;
            uint32_t YSizeForUVPurposes, YSizeForUVPurposesDimensionalAlignment;

            YSize = GFX_ULONG_CAST(pTexInfo->Pitch) * pTexInfo->BaseHeight;

            // YVU9 has one U/V pixel for each 4x4 Y block.
            // The others have one U/V pixel for each 2x2 Y block.

            // YVU9 has a Y:V size ratio of 16 (4x4 --> 1).
            // The others have a ratio of 4 (2x2 --> 1).
            YVSizeRShift = (pTexInfo->Format != GMM_FORMAT_YVU9) ? 2 : 4;

            // If a Y plane isn't fully-aligned to its Y-->U/V block size, the
            // extra/unaligned Y pixels still need corresponding U/V pixels--So
            // for the purpose of computing the UVSize, we must consider a
            // dimensionally "rounded-up" YSize. (E.g. a 13x5 YVU9 Y plane would
            // require 4x2 U/V planes--the same UVSize as a fully-aligned 16x8 Y.)
            YSizeForUVPurposesDimensionalAlignment = (pTexInfo->Format != GMM_FORMAT_YVU9) ? 2 : 4;
            YSizeForUVPurposes =
            GFX_ALIGN(GFX_ULONG_CAST(pTexInfo->Pitch), YSizeForUVPurposesDimensionalAlignment) *
            GFX_ALIGN(pTexInfo->BaseHeight, YSizeForUVPurposesDimensionalAlignment);

            VSize   = (YSizeForUVPurposes >> YVSizeRShift);
            UOffset = YSize + VSize;

            *pVOffsetX = 0;
            *pVOffsetY = pTexInfo->BaseHeight;

            *pUOffsetX = UOffset % pTexInfo->Pitch;
            *pUOffsetY = UOffset / pTexInfo->Pitch;

            YHeight = GFX_CEIL_DIV(YSize + 2 * VSize, WidthBytesPhysical);

            break;
        }
        case GMM_FORMAT_NV12:
        case GMM_FORMAT_NV21:
        case GMM_FORMAT_NV11:
        case GMM_FORMAT_P010:
        case GMM_FORMAT_P012:
        case GMM_FORMAT_P016:
        case GMM_FORMAT_P208:
        case GMM_FORMAT_P216:
        {
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // YYYYYYYY
            // [UV-Packing]
            *pUOffsetX = *pVOffsetX = 0;
            YHeight                 = GFX_ALIGN(Height, __GMM_EVEN_ROW);
            *pUOffsetY = *pVOffsetY = YHeight;

            if((pTexInfo->Format == GMM_FORMAT_NV12) ||
               (pTexInfo->Format == GMM_FORMAT_NV21) ||
               (pTexInfo->Format == GMM_FORMAT_P010) ||
               (pTexInfo->Format == GMM_FORMAT_P012) ||
               (pTexInfo->Format == GMM_FORMAT_P016))
            {
                VHeight = GFX_CEIL_DIV(Height, 2);
            }
            else
            {
                VHeight = YHeight; // U/V plane is same as Y
            }

            UVPacked = true;
            break;
        }
        default:
        {
            GMM_ASSERTDPF(0, "Unknown Video Format U\n");
            break;
        }
    }

    pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_Y] = YHeight;
    if(pTexInfo->OffsetInfo.Plane.NoOfPlanes == 2)
    {
        pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_U] = VHeight;
    }
    else if(pTexInfo->OffsetInfo.Plane.NoOfPlanes == 3)
    {
        pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_U] =
        pTexInfo->OffsetInfo.Plane.UnAligned.Height[GMM_PLANE_V] = VHeight;
    }

    if(GMM_IS_TILED(pPlatform->TileInfo[pTexInfo->TileMode]) || pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
    {
        GMM_GFX_SIZE_T TileHeight = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileHeight;
        GMM_GFX_SIZE_T TileWidth  = pPlatform->TileInfo[pTexInfo->TileMode].LogicalTileWidth;
        GMM_GFX_SIZE_T PhysicalTileHeight = TileHeight;
        if(GFX_GET_CURRENT_RENDERCORE(pPlatform->Platform) > IGFX_GEN11LP_CORE)
        {
            if(pTexInfo->Flags.Gpu.CCS && !pGmmLibContext->GetSkuTable().FtrFlatPhysCCS)
            {
                //U/V must be aligned to AuxT granularity, 4x pitchalign enforces 16K-align for 4KB tile,
                //add extra padding for 64K AuxT, 1MB AuxT
                if(GMM_IS_64KB_TILE(pTexInfo->Flags))
                {
                    TileHeight *= (!WA64K(pGmmLibContext) && !WA16K(pGmmLibContext)) ? 16 : 1; // For 64Kb Tile mode: Multiply TileHeight by 16 for 1 MB alignment
                }
                else
                {
                    PhysicalTileHeight *= (WA16K(pGmmLibContext) ? 1 : WA64K(pGmmLibContext) ? 4 : 1); //  for 1 MB AuxT granularity, we do 1 MB alignment only in VA space and not in physical space, so do not multiply PhysicalTileHeight with 64 here
                    TileHeight *= (WA16K(pGmmLibContext) ? 1 : WA64K(pGmmLibContext) ? 4 : 64);        // For 4k Tile:  Multiply TileHeight by 4 and Pitch by 4 for 64kb alignment, multiply TileHeight by 64 and Pitch by 4 for 1 MB alignment
                }
            }
        }

        *pUOffsetX = GFX_ALIGN(*pUOffsetX, TileWidth);
        *pUOffsetY = GFX_ALIGN(*pUOffsetY, TileHeight);
        *pVOffsetX = GFX_ALIGN(*pVOffsetX, TileWidth);
        *pVOffsetY = UVPacked ?
                     GFX_ALIGN(*pVOffsetY, TileHeight) :
                     GFX_ALIGN(YHeight, TileHeight) + GFX_ALIGN(VHeight, TileHeight);

        if(pTexInfo->Flags.Gpu.UnifiedAuxSurface && pTexInfo->Flags.Gpu.__NonMsaaTileYCcs)
        {
            *pUOffsetY += pTexInfo->OffsetInfo.Plane.Y[GMM_PLANE_Y];
            *pVOffsetY = *pUOffsetY;
        }

        // This is needed for FtrDisplayPageTables
        if(pGmmLibContext->GetSkuTable().FtrDisplayPageTables)
        {
            pTexInfo->OffsetInfo.Plane.Aligned.Height[GMM_PLANE_Y] = GFX_ALIGN(YHeight, TileHeight);
            if(pTexInfo->OffsetInfo.Plane.NoOfPlanes == 2)
            {
                pTexInfo->OffsetInfo.Plane.Aligned.Height[GMM_PLANE_U] = GFX_ALIGN(VHeight, TileHeight);
            }
            else if(pTexInfo->OffsetInfo.Plane.NoOfPlanes == 3)
            {
                pTexInfo->OffsetInfo.Plane.Aligned.Height[GMM_PLANE_U] =
                pTexInfo->OffsetInfo.Plane.Aligned.Height[GMM_PLANE_V] = GFX_ALIGN(VHeight, TileHeight);
            }
        }
    }

    //Special case LKF MMC compressed surfaces
    if(pTexInfo->Flags.Gpu.MMC &&
       pTexInfo->Flags.Gpu.UnifiedAuxSurface &&
       pTexInfo->Flags.Info.TiledY)
    {
        GMM_GFX_SIZE_T TileHeight = pGmmLibContext->GetPlatformInfo().TileInfo[pTexInfo->TileMode].LogicalTileHeight;
        GMM_GFX_SIZE_T TileWidth  = pGmmLibContext->GetPlatformInfo().TileInfo[pTexInfo->TileMode].LogicalTileWidth;

        *pUOffsetX = GFX_ALIGN(*pUOffsetX, TileWidth);
        *pUOffsetY = GFX_ALIGN(*pUOffsetY, TileHeight);
        *pVOffsetX = GFX_ALIGN(*pVOffsetX, TileWidth);
        *pVOffsetY = GFX_ALIGN(*pVOffsetY, TileHeight);
    }

    GMM_DPF_EXIT;

#undef SWAP_UV
}